

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::GeometryShaderRenderTest::iterate
          (GeometryShaderRenderTest *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  int iVar3;
  TestLog *pTVar4;
  TestContext *this_00;
  bool bVar5;
  int i;
  undefined4 uVar6;
  RenderTarget *pRVar7;
  undefined4 extraout_var;
  long lVar8;
  NotSupportedError *this_01;
  long *plVar9;
  ChannelOrder CVar10;
  uint uVar11;
  int iVar12;
  ulong uVar13;
  Surface *pSVar14;
  size_type *psVar15;
  int iVar16;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  int iVar17;
  void *pvVar18;
  int dy;
  int iVar19;
  bool bVar20;
  RGBA testColor;
  RGBA refcolor;
  Surface errorMask;
  Vector<int,_4> res;
  IVec4 colDiff;
  string local_440;
  string local_420;
  int local_3fc;
  LogImageSet local_3f8;
  Surface local_3b8;
  ulong local_3a0;
  string local_398;
  LogImage local_378;
  string local_2e8;
  string local_2c8;
  string local_2a8;
  string local_288;
  string local_268;
  LogImage local_248;
  undefined1 local_1b8 [32];
  _Alloc_hider local_198;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_188 [4];
  ios_base local_140 [272];
  
  iVar12 = this->m_interationCount;
  this->m_interationCount = iVar12 + 1;
  if (iVar12 == 1) {
    iVar12 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])(this);
    renderWithContext(this,this->m_glContext,(ShaderProgram *)CONCAT44(extraout_var,iVar12),
                      this->m_glResult);
    renderWithContext(this,&this->m_refContext->super_Context,
                      (ShaderProgram *)CONCAT44(extraout_var,iVar12),this->m_refResult);
  }
  else {
    if (iVar12 != 0) {
      pRVar7 = Context::getRenderTarget((this->super_TestCase).m_context);
      if (pRVar7->m_numSamples < 2) {
        tcu::Surface::Surface
                  (&local_3b8,(this->m_viewportSize).m_data[0],(this->m_viewportSize).m_data[1]);
        if ((this->m_viewportSize).m_data[0] < 1) {
          bVar5 = true;
        }
        else {
          bVar5 = true;
          iVar12 = 0;
          do {
            iVar19 = (this->m_viewportSize).m_data[1];
            if (0 < iVar19) {
              local_3fc = iVar12 + 1;
              iVar17 = 0;
              do {
                if (((iVar17 == 0 || iVar12 == 0) || (iVar17 + 1 == iVar19)) ||
                   (local_3fc == (this->m_viewportSize).m_data[0])) {
                  *(undefined4 *)
                   ((long)local_3b8.m_pixels.m_ptr + (long)(local_3b8.m_width * iVar17 + iVar12) * 4
                   ) = 0xff00ff00;
                }
                else {
                  local_420._M_dataplus._M_p._0_4_ =
                       *(undefined4 *)
                        ((long)(this->m_refResult->m_pixels).m_ptr +
                        (long)(this->m_refResult->m_width * iVar17 + iVar12) * 4);
                  uVar13 = 0xffffffff;
                  bVar20 = false;
                  do {
                    iVar19 = -1;
                    local_3a0 = uVar13;
                    do {
                      local_440._M_dataplus._M_p._0_4_ =
                           *(undefined4 *)
                            ((long)(this->m_glResult->m_pixels).m_ptr +
                            (long)((iVar19 + iVar17) * this->m_glResult->m_width +
                                  (int)uVar13 + iVar12) * 4);
                      tcu::RGBA::toIVec((RGBA *)&local_248);
                      tcu::RGBA::toIVec((RGBA *)&local_3f8);
                      local_378.m_name._M_dataplus._M_p = (char *)0x0;
                      local_378.m_name._M_string_length = 0;
                      lVar8 = 0;
                      do {
                        *(int *)((long)(&local_378.m_access.m_size + -6) + lVar8 * 4) =
                             *(int *)((long)(&local_248.m_access.m_size + -6) + lVar8 * 4) -
                             *(int *)((long)&local_3f8.m_name._M_dataplus._M_p + lVar8 * 4);
                        lVar8 = lVar8 + 1;
                      } while (lVar8 != 4);
                      local_1b8._0_4_ = R;
                      local_1b8._4_4_ = SNORM_INT8;
                      local_1b8._8_8_ = 0;
                      lVar8 = 0;
                      do {
                        iVar3 = *(int *)((long)(&local_378.m_access.m_size + -6) + lVar8 * 4);
                        iVar16 = -iVar3;
                        if (0 < iVar3) {
                          iVar16 = iVar3;
                        }
                        *(int *)(local_1b8 + lVar8 * 4) = iVar16;
                        lVar8 = lVar8 + 1;
                      } while (lVar8 != 4);
                      CVar10 = local_1b8._4_4_;
                      if ((int)local_1b8._4_4_ < (int)local_1b8._0_4_) {
                        CVar10 = local_1b8._0_4_;
                      }
                      if ((int)CVar10 <= (int)local_1b8._8_4_) {
                        CVar10 = local_1b8._8_4_;
                      }
                      if ((int)CVar10 < 0x15) {
                        bVar20 = true;
                      }
                      iVar19 = iVar19 + 1;
                    } while (iVar19 != 2);
                    uVar11 = (int)local_3a0 + 1;
                    uVar13 = (ulong)uVar11;
                  } while (uVar11 != 2);
                  if (!bVar20) {
                    bVar5 = false;
                  }
                  uVar6 = 0xff0000ff;
                  if (bVar20) {
                    uVar6 = 0xff00ff00;
                  }
                  *(undefined4 *)
                   ((long)local_3b8.m_pixels.m_ptr + (long)(local_3b8.m_width * iVar17 + iVar12) * 4
                   ) = uVar6;
                }
                iVar17 = iVar17 + 1;
                iVar19 = (this->m_viewportSize).m_data[1];
              } while (iVar17 < iVar19);
            }
            iVar12 = iVar12 + 1;
          } while (iVar12 < (this->m_viewportSize).m_data[0]);
        }
        pTVar4 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        iVar12 = (int)pTVar4;
        if (bVar5 == false) {
          local_420._M_dataplus._M_p = (pointer)&local_420.field_2;
          local_420.field_2._M_allocated_capacity._0_4_ = 0x706d6f43;
          local_420.field_2._M_allocated_capacity._4_2_ = 0x7261;
          local_420.field_2._M_local_buf[6] = 'e';
          local_420.field_2._M_local_buf[7] = ' ';
          local_420.field_2._8_6_ = 0x746c75736572;
          local_420._M_string_length = 0xe;
          local_420.field_2._M_local_buf[0xe] = '\0';
          local_440._M_dataplus._M_p = (pointer)&local_440.field_2;
          local_1b8._0_4_ = S;
          local_1b8._4_4_ = SNORM_INT8;
          local_440._M_dataplus._M_p =
               (pointer)std::__cxx11::string::_M_create((ulong *)&local_440,(ulong)local_1b8);
          local_440.field_2._M_allocated_capacity = local_1b8._0_8_;
          *(undefined8 *)local_440._M_dataplus._M_p = 0x6f20746c75736552;
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_440._M_dataplus._M_p + 8) = 'f';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_440._M_dataplus._M_p + 9) = ' ';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_440._M_dataplus._M_p + 10) = 'r';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_440._M_dataplus._M_p + 0xb) = 'e';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_440._M_dataplus._M_p + 0xc) = 'n';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_440._M_dataplus._M_p + 0xd) = 'd';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_440._M_dataplus._M_p + 0xe) = 'e';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_440._M_dataplus._M_p + 0xf) = 'r';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_440._M_dataplus._M_p + 0xf) = 'r';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_440._M_dataplus._M_p + 0x10) = 'i';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_440._M_dataplus._M_p + 0x11) = 'n';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_440._M_dataplus._M_p + 0x12) = 'g';
          local_440._M_string_length = local_1b8._0_8_;
          local_440._M_dataplus._M_p[local_1b8._0_8_] = '\0';
          tcu::LogImageSet::LogImageSet(&local_3f8,&local_420,&local_440);
          tcu::TestLog::startImageSet
                    (pTVar4,local_3f8.m_name._M_dataplus._M_p,
                     local_3f8.m_description._M_dataplus._M_p);
          local_398._M_dataplus._M_p = (pointer)&local_398.field_2;
          local_398.field_2._M_allocated_capacity._0_4_ = 0x75736552;
          local_398.field_2._M_allocated_capacity._4_2_ = 0x746c;
          local_398._M_string_length = 6;
          local_398.field_2._M_local_buf[6] = '\0';
          local_268.field_2._M_allocated_capacity._0_4_ = 0x75736552;
          local_268.field_2._M_allocated_capacity._4_2_ = 0x746c;
          local_268._M_string_length = 6;
          local_268.field_2._M_local_buf[6] = '\0';
          pSVar14 = this->m_glResult;
          local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
          tcu::LogImage::LogImage
                    ((LogImage *)local_1b8,&local_398,&local_268,pSVar14,
                     QP_IMAGE_COMPRESSION_MODE_BEST);
          tcu::LogImage::write((LogImage *)local_1b8,iVar12,__buf_00,(size_t)pSVar14);
          local_288.field_2._M_allocated_capacity = 0x636e657265666552;
          local_288.field_2._8_2_ = 0x65;
          local_288._M_string_length = 9;
          local_2a8.field_2._M_allocated_capacity = 0x636e657265666552;
          local_2a8.field_2._8_2_ = 0x65;
          local_2a8._M_string_length = 9;
          pSVar14 = this->m_refResult;
          local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
          local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
          tcu::LogImage::LogImage
                    (&local_378,&local_288,&local_2a8,pSVar14,QP_IMAGE_COMPRESSION_MODE_BEST);
          tcu::LogImage::write(&local_378,iVar12,__buf_01,(size_t)pSVar14);
          local_2c8.field_2._M_allocated_capacity = 0x73614d726f727245;
          local_2c8.field_2._8_2_ = 0x6b;
          local_2c8._M_string_length = 9;
          local_2e8.field_2._M_allocated_capacity = 0x616d20726f727245;
          local_2e8.field_2._8_2_ = 0x6b73;
          local_2e8._M_string_length = 10;
          local_2e8.field_2._M_local_buf[10] = '\0';
          pSVar14 = &local_3b8;
          local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
          local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
          tcu::LogImage::LogImage
                    (&local_248,&local_2c8,&local_2e8,pSVar14,QP_IMAGE_COMPRESSION_MODE_BEST);
          tcu::LogImage::write(&local_248,iVar12,__buf_02,(size_t)pSVar14);
          tcu::TestLog::endImageSet(pTVar4);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_248.m_description._M_dataplus._M_p != &local_248.m_description.field_2) {
            operator_delete(local_248.m_description._M_dataplus._M_p,
                            local_248.m_description.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_248.m_name._M_dataplus._M_p != &local_248.m_name.field_2) {
            operator_delete(local_248.m_name._M_dataplus._M_p,
                            CONCAT26(local_248.m_name.field_2._M_allocated_capacity._6_2_,
                                     local_248.m_name.field_2._M_allocated_capacity._0_6_) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
            operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
            operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_378.m_description._M_dataplus._M_p != &local_378.m_description.field_2) {
            operator_delete(local_378.m_description._M_dataplus._M_p,
                            local_378.m_description.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_378.m_name._M_dataplus._M_p != &local_378.m_name.field_2) {
            operator_delete(local_378.m_name._M_dataplus._M_p,
                            local_378.m_name.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
            operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_288._M_dataplus._M_p != &local_288.field_2) {
            operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_198._M_p != local_188) {
            operator_delete(local_198._M_p,local_188[0]._M_allocated_capacity + 1);
          }
          if (local_1b8._0_8_ != (long)local_1b8 + 0x10) {
            operator_delete((void *)local_1b8._0_8_,local_1b8._16_8_ + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_268._M_dataplus._M_p != &local_268.field_2) {
            operator_delete(local_268._M_dataplus._M_p,
                            CONCAT17(local_268.field_2._M_local_buf[7],
                                     CONCAT16(local_268.field_2._M_local_buf[6],
                                              CONCAT24(local_268.field_2._M_allocated_capacity._4_2_
                                                       ,local_268.field_2._M_allocated_capacity.
                                                        _0_4_))) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_398._M_dataplus._M_p != &local_398.field_2) {
            operator_delete(local_398._M_dataplus._M_p,
                            CONCAT17(local_398.field_2._M_local_buf[7],
                                     CONCAT16(local_398.field_2._M_local_buf[6],
                                              CONCAT24(local_398.field_2._M_allocated_capacity._4_2_
                                                       ,local_398.field_2._M_allocated_capacity.
                                                        _0_4_))) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3f8.m_description._M_dataplus._M_p != &local_3f8.m_description.field_2) {
            operator_delete(local_3f8.m_description._M_dataplus._M_p,
                            local_3f8.m_description.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3f8.m_name._M_dataplus._M_p != &local_3f8.m_name.field_2) {
            operator_delete(local_3f8.m_name._M_dataplus._M_p,
                            (ulong)(local_3f8.m_name.field_2._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_440._M_dataplus._M_p != &local_440.field_2) {
            operator_delete(local_440._M_dataplus._M_p,
                            (ulong)(local_440.field_2._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_420._M_dataplus._M_p != &local_420.field_2) {
            operator_delete(local_420._M_dataplus._M_p,
                            CONCAT17(local_420.field_2._M_local_buf[7],
                                     CONCAT16(local_420.field_2._M_local_buf[6],
                                              CONCAT24(local_420.field_2._M_allocated_capacity._4_2_
                                                       ,local_420.field_2._M_allocated_capacity.
                                                        _0_4_))) + 1);
          }
          local_1b8._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b8 + 8));
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_1b8 + 8),"Image compare failed.",0x15);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        }
        else {
          paVar2 = &local_248.m_name.field_2;
          local_248.m_name.field_2._M_allocated_capacity._0_6_ = 0x7261706d6f43;
          local_248.m_name.field_2._M_allocated_capacity._6_2_ = 0x2065;
          local_248.m_name.field_2._8_6_ = 0x746c75736572;
          local_248.m_name._M_string_length = 0xe;
          local_248.m_name.field_2._M_local_buf[0xe] = '\0';
          paVar1 = &local_3f8.m_name.field_2;
          local_1b8._0_4_ = S;
          local_1b8._4_4_ = SNORM_INT8;
          local_3f8.m_name._M_dataplus._M_p = (pointer)paVar1;
          local_248.m_name._M_dataplus._M_p = (pointer)paVar2;
          local_3f8.m_name._M_dataplus._M_p =
               (pointer)std::__cxx11::string::_M_create((ulong *)&local_3f8,(ulong)local_1b8);
          local_3f8.m_name.field_2._M_allocated_capacity = local_1b8._0_8_;
          builtin_strncpy(local_3f8.m_name._M_dataplus._M_p,"Result of rendering",0x13);
          local_3f8.m_name._M_string_length = local_1b8._0_8_;
          local_3f8.m_name._M_dataplus._M_p[local_1b8._0_8_] = '\0';
          tcu::LogImageSet::LogImageSet
                    ((LogImageSet *)&local_378,&local_248.m_name,&local_3f8.m_name);
          tcu::TestLog::startImageSet
                    (pTVar4,local_378.m_name._M_dataplus._M_p,
                     local_378.m_description._M_dataplus._M_p);
          local_420.field_2._M_allocated_capacity._0_4_ = 0x75736552;
          local_420.field_2._M_allocated_capacity._4_2_ = 0x746c;
          local_420._M_string_length = 6;
          local_420.field_2._M_local_buf[6] = '\0';
          local_440._M_string_length._0_4_ = RA;
          local_440._M_string_length._4_4_ = SNORM_INT8;
          local_440.field_2._M_allocated_capacity._0_7_ = 0x746c75736552;
          pSVar14 = this->m_glResult;
          local_440._M_dataplus._M_p = (pointer)&local_440.field_2;
          local_420._M_dataplus._M_p = (pointer)&local_420.field_2;
          tcu::LogImage::LogImage
                    ((LogImage *)local_1b8,&local_420,&local_440,pSVar14,
                     QP_IMAGE_COMPRESSION_MODE_BEST);
          tcu::LogImage::write((LogImage *)local_1b8,iVar12,__buf,(size_t)pSVar14);
          tcu::TestLog::endImageSet(pTVar4);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_198._M_p != local_188) {
            operator_delete(local_198._M_p,local_188[0]._M_allocated_capacity + 1);
          }
          if (local_1b8._0_8_ != (long)local_1b8 + 0x10) {
            operator_delete((void *)local_1b8._0_8_,local_1b8._16_8_ + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_440._M_dataplus._M_p != &local_440.field_2) {
            operator_delete(local_440._M_dataplus._M_p,
                            (ulong)(local_440.field_2._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_420._M_dataplus._M_p != &local_420.field_2) {
            operator_delete(local_420._M_dataplus._M_p,
                            CONCAT17(local_420.field_2._M_local_buf[7],
                                     CONCAT16(local_420.field_2._M_local_buf[6],
                                              CONCAT24(local_420.field_2._M_allocated_capacity._4_2_
                                                       ,local_420.field_2._M_allocated_capacity.
                                                        _0_4_))) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_378.m_description._M_dataplus._M_p != &local_378.m_description.field_2) {
            operator_delete(local_378.m_description._M_dataplus._M_p,
                            local_378.m_description.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_378.m_name._M_dataplus._M_p != &local_378.m_name.field_2) {
            operator_delete(local_378.m_name._M_dataplus._M_p,
                            local_378.m_name.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3f8.m_name._M_dataplus._M_p != paVar1) {
            operator_delete(local_3f8.m_name._M_dataplus._M_p,
                            (ulong)(local_3f8.m_name.field_2._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_248.m_name._M_dataplus._M_p != paVar2) {
            operator_delete(local_248.m_name._M_dataplus._M_p,
                            CONCAT26(local_248.m_name.field_2._M_allocated_capacity._6_2_,
                                     local_248.m_name.field_2._M_allocated_capacity._0_6_) + 1);
          }
          local_1b8._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b8 + 8));
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_1b8 + 8),"Image compare ok.",0x11);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b8 + 8));
        std::ios_base::~ios_base(local_140);
        tcu::Surface::~Surface(&local_3b8);
      }
      else {
        pTVar4 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        pSVar14 = this->m_refResult;
        local_378.m_name._M_dataplus._M_p = (char *)0x300000008;
        pvVar18 = (void *)(pSVar14->m_pixels).m_cap;
        if (pvVar18 != (void *)0x0) {
          pvVar18 = (pSVar14->m_pixels).m_ptr;
        }
        tcu::PixelBufferAccess::PixelBufferAccess
                  ((PixelBufferAccess *)local_1b8,(TextureFormat *)&local_378,pSVar14->m_width,
                   pSVar14->m_height,1,pvVar18);
        pSVar14 = this->m_glResult;
        local_248.m_name._M_dataplus._M_p = (pointer)0x300000008;
        pvVar18 = (void *)(pSVar14->m_pixels).m_cap;
        if (pvVar18 != (void *)0x0) {
          pvVar18 = (pSVar14->m_pixels).m_ptr;
        }
        tcu::PixelBufferAccess::PixelBufferAccess
                  ((PixelBufferAccess *)&local_378,(TextureFormat *)&local_248,pSVar14->m_width,
                   pSVar14->m_height,1,pvVar18);
        bVar5 = tcu::fuzzyCompare(pTVar4,"Compare Results","Compare Results",
                                  (ConstPixelBufferAccess *)local_1b8,
                                  (ConstPixelBufferAccess *)&local_378,0.02,COMPARE_LOG_RESULT);
      }
      this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
      if (bVar5 != false) {
        tcu::TestContext::setTestResult(this_00,QP_TEST_RESULT_PASS,"Pass");
        return STOP;
      }
      tcu::TestContext::setTestResult(this_00,QP_TEST_RESULT_FAIL,"Image comparison failed");
      return STOP;
    }
    pRVar7 = Context::getRenderTarget((this->super_TestCase).m_context);
    iVar12 = pRVar7->m_width;
    pRVar7 = Context::getRenderTarget((this->super_TestCase).m_context);
    if ((iVar12 < (this->m_viewportSize).m_data[0]) ||
       (pRVar7->m_height < (this->m_viewportSize).m_data[1])) {
      this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      local_3f8.m_name._M_dataplus._M_p = (pointer)&local_3f8.m_name.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_3f8,"Render target size must be at least ","");
      de::toString<int>(&local_420,(this->m_viewportSize).m_data);
      std::operator+(&local_248.m_name,&local_3f8.m_name,&local_420);
      plVar9 = (long *)std::__cxx11::string::append((char *)&local_248);
      local_378.m_name._M_dataplus._M_p = (pointer)*plVar9;
      psVar15 = (size_type *)(plVar9 + 2);
      if ((size_type *)local_378.m_name._M_dataplus._M_p == psVar15) {
        local_378.m_name.field_2._M_allocated_capacity = *psVar15;
        local_378.m_name.field_2._8_8_ = plVar9[3];
        local_378.m_name._M_dataplus._M_p = (pointer)&local_378.m_name.field_2;
      }
      else {
        local_378.m_name.field_2._M_allocated_capacity = *psVar15;
      }
      local_378.m_name._M_string_length = plVar9[1];
      *plVar9 = (long)psVar15;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      de::toString<int>(&local_440,(this->m_viewportSize).m_data + 1);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8,
                     &local_378.m_name,&local_440);
      tcu::NotSupportedError::NotSupportedError(this_01,(string *)local_1b8);
      __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[6])(this);
  }
  return CONTINUE;
}

Assistant:

tcu::TestCase::IterateResult GeometryShaderRenderTest::iterate (void)
{
	// init() must be called
	DE_ASSERT(m_glContext);
	DE_ASSERT(m_refContext);

	const int iteration = m_interationCount++;

	if (iteration == 0)
	{
		// Check requirements
		const int width	 = m_context.getRenderTarget().getWidth();
		const int height = m_context.getRenderTarget().getHeight();

		if (width < m_viewportSize.x() || height < m_viewportSize.y())
			throw tcu::NotSupportedError(std::string("Render target size must be at least ") + de::toString(m_viewportSize.x()) + "x" + de::toString(m_viewportSize.y()));

		// Gen data
		genVertexAttribData();

		return CONTINUE;
	}
	else if (iteration == 1)
	{
		// Render
		sglr::ShaderProgram& program = getProgram();

		renderWithContext(*m_glContext, program, *m_glResult);
		renderWithContext(*m_refContext, program, *m_refResult);

		return CONTINUE;
	}
	else
	{
		if (compare())
			m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		else
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image comparison failed");

		return STOP;
	}
}